

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_mb.cpp
# Opt level: O1

PrimInfoMB * __thiscall
embree::avx::BVHNBuilderMBlurSAHGrid<4>::createPrimRefArrayMSMBlurGrid
          (PrimInfoMB *__return_storage_ptr__,BVHNBuilderMBlurSAHGrid<4> *this,Scene *scene,
          mvector<PrimRefMB> *prims,BuildProgressMonitor *progressMonitor,BBox1f t0t1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  Geometry *pGVar6;
  SubGridBuildData *ptr;
  PrimRefMB *ptr_00;
  MemoryMonitorInterface *pMVar7;
  unsigned_long uVar8;
  size_t sVar9;
  size_t sVar10;
  BBox1f BVar11;
  BBox1f BVar12;
  char cVar13;
  int iVar14;
  ulong uVar15;
  BBox1f BVar16;
  SubGridBuildData *pSVar17;
  PrimRefMB *pPVar18;
  runtime_error *prVar19;
  ulong uVar20;
  ulong uVar21;
  size_t sVar22;
  long lVar23;
  ulong uVar24;
  ParallelPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *pPVar25;
  BBox1f *pBVar26;
  task_group_context *context_00;
  size_t sVar27;
  ulong uVar28;
  ulong uVar29;
  mvector<PrimRefMB> *pmVar30;
  ulong uVar31;
  bool bVar32;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar34;
  undefined1 in_register_00001208 [56];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar35;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar37;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar39;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar40;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar41;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar42;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar43;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar44;
  undefined1 auVar45 [16];
  range<unsigned_long> rVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  size_t taskCount_1;
  Iterator<embree::GridMesh,_true> iter;
  size_t taskCount;
  task_group_context context;
  ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> pstate;
  anon_class_1_0_00000001 local_4dea;
  auto_partitioner local_4de9;
  mvector<PrimRefMB> *local_4de8;
  BBox1f local_4de0;
  BBox1f local_4dd8;
  Scene *local_4dd0;
  bool local_4dc8;
  BBox1f local_4dc0;
  BBox1f local_4db8;
  anon_class_16_2_341d598e_conflict2 local_4db0;
  anon_class_16_2_341d598e_conflict2 local_4da0;
  mvector<PrimRefMB> *local_4d90;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_4d88;
  undefined4 local_4d78;
  undefined4 uStack_4d74;
  undefined4 uStack_4d70;
  undefined4 uStack_4d6c;
  undefined4 local_4d68;
  undefined4 uStack_4d64;
  undefined4 uStack_4d60;
  undefined4 uStack_4d5c;
  undefined4 local_4d58;
  undefined4 uStack_4d54;
  undefined4 uStack_4d50;
  undefined4 uStack_4d4c;
  undefined4 local_4d48;
  undefined4 uStack_4d44;
  undefined4 uStack_4d40;
  undefined4 uStack_4d3c;
  undefined4 local_4d38;
  undefined4 uStack_4d34;
  undefined4 uStack_4d30;
  undefined4 uStack_4d2c;
  unsigned_long local_4d28;
  unsigned_long uStack_4d20;
  size_t sStack_4d18;
  size_t sStack_4d10;
  float local_4d08;
  float fStack_4d04;
  float fStack_4d00;
  float fStack_4cfc;
  anon_class_48_6_afa08d2e_conflict2 local_4cf8;
  task_group_context local_4cc8;
  ParallelForForPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> local_4c48;
  
  auVar48._8_56_ = in_register_00001208;
  auVar48._0_8_ = t0t1;
  local_4de0 = (BBox1f)vmovlps_avx(auVar48._0_16_);
  local_4c48.super_ParallelForForState.taskCount = 0;
  local_4dc8 = false;
  sVar27 = (scene->geometries).size_active;
  if (sVar27 == 0) {
    uVar29 = 0;
  }
  else {
    uVar29 = 0;
    sVar22 = 0;
    do {
      pGVar6 = (scene->geometries).items[sVar22].ptr;
      if ((((pGVar6 == (Geometry *)0x0) || (((pGVar6->field_8).field_0x2 & 0x20) == 0)) ||
          (*(char *)&pGVar6->field_8 != '\x16')) || (pGVar6->numTimeSteps == 1)) {
        uVar20 = 0;
      }
      else {
        uVar20 = (ulong)pGVar6->numPrimitives;
      }
      uVar29 = uVar29 + uVar20;
      sVar22 = sVar22 + 1;
    } while (sVar27 != sVar22);
  }
  local_4de8 = prims;
  local_4dd0 = scene;
  local_4c48.super_ParallelForForState.N = uVar29;
  iVar14 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  uVar20 = uVar29 + 0x3ff >> 10;
  if ((ulong)(long)iVar14 < uVar20) {
    uVar20 = (long)iVar14;
  }
  uVar24 = 0x40;
  if (uVar20 < 0x40) {
    uVar24 = uVar20;
  }
  local_4c48.super_ParallelForForState.taskCount = uVar24 + (uVar24 == 0);
  local_4c48.super_ParallelForForState.i0[0] = 0;
  local_4c48.super_ParallelForForState.j0[0] = 0;
  if (1 < uVar20) {
    uVar24 = 0;
    uVar20 = uVar29 / local_4c48.super_ParallelForForState.taskCount;
    BVar16.lower = 1.4013e-45;
    BVar16.upper = 0.0;
    sVar27 = 0;
    do {
      pGVar6 = (local_4dd0->geometries).items[sVar27].ptr;
      if ((((pGVar6 == (Geometry *)0x0) ||
           (((local_4dc8 & 1U) == 0 && (((pGVar6->field_8).field_0x2 & 0x20) == 0)))) ||
          (*(char *)&pGVar6->field_8 != '\x16')) || (pGVar6->numTimeSteps == 1)) {
        uVar28 = 0;
      }
      else {
        uVar28 = (ulong)pGVar6->numPrimitives;
      }
      if (uVar28 == 0) {
        lVar23 = 0;
      }
      else {
        uVar21 = ((long)BVar16 + 1U) * uVar29;
        lVar23 = 0;
        uVar31 = 0;
        do {
          uVar15 = uVar20;
          uVar20 = uVar15;
          if ((uVar28 + uVar24 + lVar23 < uVar15) ||
             (local_4c48.super_ParallelForForState.taskCount <= (ulong)BVar16)) break;
          local_4c48.super_ParallelForForState.i0[(long)BVar16] = sVar27;
          uVar31 = uVar31 + (uVar15 - uVar24);
          local_4c48.super_ParallelForForState.j0[(long)BVar16] = uVar31;
          BVar16 = (BBox1f)((long)BVar16 + 1);
          uVar20 = uVar21 / local_4c48.super_ParallelForForState.taskCount;
          lVar23 = -uVar31;
          uVar21 = uVar21 + uVar29;
          uVar24 = uVar15;
        } while (uVar31 < uVar28);
      }
      uVar24 = uVar24 + uVar28 + lVar23;
      sVar27 = sVar27 + 1;
    } while ((ulong)BVar16 < local_4c48.super_ParallelForForState.taskCount);
  }
  sVar27 = local_4c48.super_ParallelForForState.taskCount;
  local_4cf8.identity = (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4d88;
  local_4d88.m128[0] = INFINITY;
  local_4d88.m128[1] = INFINITY;
  local_4d88.m128[2] = INFINITY;
  local_4d88.m128[3] = INFINITY;
  local_4d78 = 0xff800000;
  uStack_4d74 = 0xff800000;
  uStack_4d70 = 0xff800000;
  uStack_4d6c = 0xff800000;
  local_4d68 = 0x7f800000;
  uStack_4d64 = 0x7f800000;
  uStack_4d60 = 0x7f800000;
  uStack_4d5c = 0x7f800000;
  local_4d58 = 0xff800000;
  uStack_4d54 = 0xff800000;
  uStack_4d50 = 0xff800000;
  uStack_4d4c = 0xff800000;
  local_4d48 = 0x7f800000;
  uStack_4d44 = 0x7f800000;
  uStack_4d40 = 0x7f800000;
  uStack_4d3c = 0x7f800000;
  local_4d38 = 0xff800000;
  uStack_4d34 = 0xff800000;
  uStack_4d30 = 0xff800000;
  uStack_4d2c = 0xff800000;
  local_4d28 = 0;
  uStack_4d20 = 0;
  sStack_4d18 = 0;
  sStack_4d10 = 0;
  local_4d08 = 0.0;
  auVar55._8_4_ = 0x3f800000;
  auVar55._0_8_ = &DAT_3f8000003f800000;
  auVar55._12_4_ = 0x3f800000;
  uVar4 = vmovlps_avx(auVar55);
  fStack_4d04 = (float)uVar4;
  fStack_4d00 = (float)((ulong)uVar4 >> 0x20);
  fStack_4cfc = 0.0;
  local_4dc0 = (BBox1f)&local_4de0;
  local_4da0.func = (anon_class_8_1_89912a77 *)&local_4dc0;
  local_4dd8 = (BBox1f)&local_4dd0;
  local_4cf8.getSize = (anon_class_8_1_4d25ca37_conflict *)&local_4dd8;
  local_4cf8.func = &local_4da0;
  local_4cf8.taskCount = (size_t *)&local_4db8;
  local_4cf8.state = &local_4c48;
  local_4cf8.reduction = &local_4dea;
  context_00 = &local_4cc8;
  local_4cc8.my_version = proxy_support;
  local_4cc8.my_traits = (context_traits)0x4;
  local_4cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_4cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_4cc8.my_name = CUSTOM_CTX;
  local_4db8 = (BBox1f)local_4c48.super_ParallelForForState.taskCount;
  local_4da0.array2 = (Iterator<embree::GridMesh,_true> *)local_4dd8;
  tbb::detail::r1::initialize(context_00);
  local_4db0.func = (anon_class_8_1_89912a77 *)&local_4cf8;
  tbb::detail::d1::
  parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
            (0,sVar27,1,(anon_class_8_1_898bcfc2_conflict10 *)&local_4db0,&local_4de9,context_00);
  cVar13 = tbb::detail::r1::is_group_execution_cancelled(&local_4cc8);
  if (cVar13 != '\0') {
    prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar19,"task cancelled");
    __cxa_throw(prVar19,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_4cc8);
  aVar33.m128[1] = local_4d88.m128[1];
  aVar33.m128[0] = local_4d88.m128[0];
  aVar33.m128[2] = local_4d88.m128[2];
  aVar33.m128[3] = local_4d88.m128[3];
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar33;
  aVar35.m128[1] = (float)uStack_4d74;
  aVar35.m128[0] = (float)local_4d78;
  aVar35.m128[2] = (float)uStack_4d70;
  aVar35.m128[3] = (float)uStack_4d6c;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar35;
  aVar37.m128[1] = (float)uStack_4d64;
  aVar37.m128[0] = (float)local_4d68;
  aVar37.m128[2] = (float)uStack_4d60;
  aVar37.m128[3] = (float)uStack_4d5c;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar37;
  aVar39.m128[1] = (float)uStack_4d54;
  aVar39.m128[0] = (float)local_4d58;
  aVar39.m128[2] = (float)uStack_4d50;
  aVar39.m128[3] = (float)uStack_4d4c;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar39;
  aVar41.m128[1] = (float)uStack_4d44;
  aVar41.m128[0] = (float)local_4d48;
  aVar41.m128[2] = (float)uStack_4d40;
  aVar41.m128[3] = (float)uStack_4d3c;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar41;
  aVar43.m128[1] = (float)uStack_4d34;
  aVar43.m128[0] = (float)local_4d38;
  aVar43.m128[2] = (float)uStack_4d30;
  aVar43.m128[3] = (float)uStack_4d2c;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar43;
  (__return_storage_ptr__->object_range)._begin = local_4d28;
  (__return_storage_ptr__->object_range)._end = uStack_4d20;
  BVar11.upper = fStack_4d04;
  BVar11.lower = local_4d08;
  BVar12.upper = fStack_4cfc;
  BVar12.lower = fStack_4d00;
  __return_storage_ptr__->num_time_segments = sStack_4d18;
  __return_storage_ptr__->max_num_time_segments = sStack_4d10;
  __return_storage_ptr__->max_time_range = BVar11;
  __return_storage_ptr__->time_range = BVar12;
  if (local_4db8 != (BBox1f)0x0) {
    sVar27 = __return_storage_ptr__->num_time_segments;
    pPVar25 = &local_4c48.prefix_state;
    auVar45._8_8_ = 0;
    auVar45._0_4_ = (__return_storage_ptr__->max_time_range).lower;
    auVar45._4_4_ = (__return_storage_ptr__->max_time_range).upper;
    auVar48 = ZEXT864((ulong)__return_storage_ptr__->time_range);
    rVar46 = __return_storage_ptr__->object_range;
    sVar22 = __return_storage_ptr__->max_num_time_segments;
    BVar16 = local_4db8;
    do {
      uVar29 = pPVar25->counts[0].max_num_time_segments;
      uVar3 = pPVar25->counts[0].max_time_range.lower;
      uVar5 = pPVar25->counts[0].max_time_range.upper;
      auVar50._4_4_ = uVar5;
      auVar50._0_4_ = uVar3;
      auVar50._8_8_ = 0;
      pPVar25->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
      field_0 = aVar33;
      pPVar25->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
      field_0 = aVar35;
      pPVar25->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
      field_0 = aVar37;
      pPVar25->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.
      field_0 = aVar39;
      pPVar25->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0 =
           aVar41;
      pPVar25->sums[0].super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0 =
           aVar43;
      uVar8 = (__return_storage_ptr__->object_range)._end;
      sVar9 = __return_storage_ptr__->num_time_segments;
      sVar10 = __return_storage_ptr__->max_num_time_segments;
      pPVar25->sums[0].object_range._begin = (__return_storage_ptr__->object_range)._begin;
      pPVar25->sums[0].object_range._end = uVar8;
      pPVar25->sums[0].num_time_segments = sVar9;
      pPVar25->sums[0].max_num_time_segments = sVar10;
      auVar47 = auVar48._0_16_;
      auVar55 = vmovlhps_avx(auVar45,auVar47);
      pPVar25->sums[0].max_time_range.lower = (float)(int)auVar55._0_8_;
      pPVar25->sums[0].max_time_range.upper = (float)(int)((ulong)auVar55._0_8_ >> 0x20);
      pPVar25->sums[0].time_range.lower = (float)(int)auVar55._8_8_;
      pPVar25->sums[0].time_range.upper = (float)(int)((ulong)auVar55._8_8_ >> 0x20);
      aVar33.m128 = (__m128)vminps_avx(aVar33.m128,
                                       pPVar25->counts[0].
                                       super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                                       bounds0.lower.field_0);
      aVar35.m128 = (__m128)vmaxps_avx(aVar35.m128,
                                       pPVar25->counts[0].
                                       super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                                       bounds0.upper.field_0);
      aVar37.m128 = (__m128)vminps_avx(aVar37.m128,
                                       pPVar25->counts[0].
                                       super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                                       bounds1.lower.field_0);
      aVar39.m128 = (__m128)vmaxps_avx(aVar39.m128,
                                       pPVar25->counts[0].
                                       super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
                                       bounds1.upper.field_0);
      aVar41.m128 = (__m128)vminps_avx(aVar41.m128,
                                       pPVar25->counts[0].
                                       super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
                                       lower.field_0);
      aVar43.m128 = (__m128)vmaxps_avx(aVar43.m128,
                                       pPVar25->counts[0].
                                       super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
                                       upper.field_0);
      sVar27 = sVar27 + pPVar25->counts[0].num_time_segments;
      auVar52._8_8_ = 0;
      auVar52._0_4_ = pPVar25->counts[0].time_range.lower;
      auVar52._4_4_ = pPVar25->counts[0].time_range.upper;
      auVar53 = vcmpps_avx(auVar47,auVar52,1);
      auVar49 = vinsertps_avx(auVar47,auVar52,0x50);
      auVar55 = vblendps_avx(auVar52,auVar47,2);
      auVar55 = vblendvps_avx(auVar55,auVar49,auVar53);
      auVar48 = ZEXT1664(auVar55);
      context_00 = (task_group_context *)CONCAT71((int7)((ulong)context_00 >> 8),sVar22 < uVar29);
      auVar53 = vpshufd_avx(ZEXT416((uint)context_00),0x50);
      auVar53 = vpslld_avx(auVar53,0x1f);
      auVar45 = vblendvps_avx(auVar45,auVar50,auVar53);
      if (sVar22 <= uVar29) {
        sVar22 = uVar29;
      }
      rVar46 = (range<unsigned_long>)
               vpaddq_avx((undefined1  [16])rVar46,(undefined1  [16])pPVar25->counts[0].object_range
                         );
      __return_storage_ptr__->object_range = rVar46;
      __return_storage_ptr__->num_time_segments = sVar27;
      __return_storage_ptr__->max_num_time_segments = sVar22;
      pPVar25 = (ParallelPrefixSumState<embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_> *)
                (pPVar25->counts + 1);
      BVar16 = (BBox1f)((long)BVar16 - 1);
    } while (BVar16 != (BBox1f)0x0);
    auVar55 = vmovlhps_avx(auVar45,auVar55);
    (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar55._0_8_;
    (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar55._0_8_ >> 0x20);
    (__return_storage_ptr__->time_range).lower = (float)(int)auVar55._8_8_;
    (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar55._8_8_ >> 0x20);
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar33;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar35;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar37;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar39;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar41;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar43;
  uVar29 = (__return_storage_ptr__->object_range)._end -
           (__return_storage_ptr__->object_range)._begin;
  if (uVar29 != 0) {
    uVar20 = (this->sgrids).size_alloced;
    uVar24 = uVar20;
    if ((uVar20 < uVar29) && (uVar24 = uVar29, uVar20 != 0)) {
      while (uVar24 = uVar20, uVar24 < uVar29) {
        uVar20 = uVar24 * 2 + (ulong)(uVar24 * 2 == 0);
      }
    }
    if (uVar29 < (this->sgrids).size_active) {
      (this->sgrids).size_active = uVar29;
    }
    if ((this->sgrids).size_alloced == uVar24) {
      (this->sgrids).size_active = uVar29;
    }
    else {
      ptr = (this->sgrids).items;
      if (uVar24 != 0) {
        pMVar7 = (this->sgrids).alloc.device;
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,uVar24 * 8,0);
      }
      uVar20 = uVar24 * 8;
      if (uVar20 < 0x1c00000) {
        pSVar17 = (SubGridBuildData *)alignedMalloc(uVar20,4);
      }
      else {
        pSVar17 = (SubGridBuildData *)os_malloc(uVar20,&(this->sgrids).alloc.hugepages);
      }
      (this->sgrids).items = pSVar17;
      if ((this->sgrids).size_active != 0) {
        uVar20 = 0;
        do {
          (this->sgrids).items[uVar20] = ptr[uVar20];
          uVar20 = uVar20 + 1;
        } while (uVar20 < (this->sgrids).size_active);
      }
      sVar27 = (this->sgrids).size_alloced;
      if (ptr != (SubGridBuildData *)0x0) {
        if (sVar27 * 8 < 0x1c00000) {
          alignedFree(ptr);
        }
        else {
          os_free(ptr,sVar27 * 8,(this->sgrids).alloc.hugepages);
        }
      }
      if (sVar27 != 0) {
        pMVar7 = (this->sgrids).alloc.device;
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar27 * -8,1);
      }
      (this->sgrids).size_active = uVar29;
      (this->sgrids).size_alloced = uVar24;
    }
    pmVar30 = local_4de8;
    uVar20 = local_4de8->size_alloced;
    uVar24 = uVar20;
    if ((uVar20 < uVar29) && (uVar24 = uVar29, uVar28 = uVar20, uVar20 != 0)) {
      while (uVar24 = uVar28, uVar24 < uVar29) {
        uVar28 = uVar24 * 2 + (ulong)(uVar24 * 2 == 0);
      }
    }
    if (uVar29 < local_4de8->size_active) {
      local_4de8->size_active = uVar29;
    }
    if (uVar20 == uVar24) {
      local_4de8->size_active = uVar29;
    }
    else {
      ptr_00 = local_4de8->items;
      if (uVar24 != 0) {
        pMVar7 = (local_4de8->alloc).device;
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,uVar24 * 0x50,0);
      }
      uVar20 = uVar24 * 0x50;
      if (uVar20 < 0x1c00000) {
        pPVar18 = (PrimRefMB *)alignedMalloc(uVar20,0x10);
      }
      else {
        pPVar18 = (PrimRefMB *)os_malloc(uVar20,&(pmVar30->alloc).hugepages);
      }
      pmVar30->items = pPVar18;
      if (pmVar30->size_active != 0) {
        lVar23 = 0x40;
        uVar20 = 0;
        do {
          pPVar18 = pmVar30->items;
          puVar1 = (undefined8 *)((long)ptr_00 + lVar23 + -0x40);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)pPVar18 + lVar23 + -0x40);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          puVar1 = (undefined8 *)((long)ptr_00 + lVar23 + -0x30);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)pPVar18 + lVar23 + -0x30);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          puVar1 = (undefined8 *)((long)ptr_00 + lVar23 + -0x20);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)pPVar18 + lVar23 + -0x20);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          puVar1 = (undefined8 *)((long)ptr_00 + lVar23 + -0x10);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)pPVar18 + lVar23 + -0x10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          *(undefined8 *)((long)&(pPVar18->lbounds).bounds0.lower.field_0 + lVar23) =
               *(undefined8 *)((long)&(ptr_00->lbounds).bounds0.lower.field_0 + lVar23);
          uVar20 = uVar20 + 1;
          lVar23 = lVar23 + 0x50;
        } while (uVar20 < pmVar30->size_active);
      }
      sVar27 = pmVar30->size_alloced;
      if (ptr_00 != (PrimRefMB *)0x0) {
        if (sVar27 * 0x50 < 0x1c00000) {
          alignedFree(ptr_00);
        }
        else {
          os_free(ptr_00,sVar27 * 0x50,(local_4de8->alloc).hugepages);
        }
      }
      pmVar30 = local_4de8;
      if (sVar27 != 0) {
        pMVar7 = (local_4de8->alloc).device;
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar27 * -0x50,1);
      }
      pmVar30->size_active = uVar29;
      pmVar30->size_alloced = uVar24;
    }
    sVar27 = local_4c48.super_ParallelForForState.taskCount;
    local_4d88.m128[0] = INFINITY;
    local_4d88.m128[1] = INFINITY;
    local_4d88.m128[2] = INFINITY;
    local_4d88.m128[3] = INFINITY;
    local_4d78 = 0xff800000;
    uStack_4d74 = 0xff800000;
    uStack_4d70 = 0xff800000;
    uStack_4d6c = 0xff800000;
    local_4d68 = 0x7f800000;
    uStack_4d64 = 0x7f800000;
    uStack_4d60 = 0x7f800000;
    uStack_4d5c = 0x7f800000;
    local_4d58 = 0xff800000;
    uStack_4d54 = 0xff800000;
    uStack_4d50 = 0xff800000;
    uStack_4d4c = 0xff800000;
    local_4d48 = 0x7f800000;
    uStack_4d44 = 0x7f800000;
    uStack_4d40 = 0x7f800000;
    uStack_4d3c = 0x7f800000;
    local_4d38 = 0xff800000;
    uStack_4d34 = 0xff800000;
    uStack_4d30 = 0xff800000;
    uStack_4d2c = 0xff800000;
    local_4d28 = 0;
    uStack_4d20 = 0;
    sStack_4d18 = 0;
    sStack_4d10 = 0;
    local_4d08 = 0.0;
    auVar53._8_4_ = 0x3f800000;
    auVar53._0_8_ = &DAT_3f8000003f800000;
    auVar53._12_4_ = 0x3f800000;
    uVar4 = vmovlps_avx(auVar53);
    fStack_4d04 = (float)uVar4;
    fStack_4d00 = (float)((ulong)uVar4 >> 0x20);
    fStack_4cfc = 0.0;
    local_4da0.func = (anon_class_8_1_89912a77 *)&local_4de0;
    local_4dc0 = (BBox1f)&local_4dd0;
    local_4db0.func = (anon_class_8_1_89912a77 *)&local_4da0;
    local_4dd8.lower = (float)(undefined4)local_4c48.super_ParallelForForState.taskCount;
    local_4dd8.upper = (float)local_4c48.super_ParallelForForState.taskCount._4_4_;
    local_4cf8.state = &local_4c48;
    local_4cf8.taskCount = (size_t *)&local_4dd8;
    local_4cf8.identity = (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_4d88;
    local_4cf8.getSize = (anon_class_8_1_4d25ca37_conflict *)&local_4dc0;
    local_4cf8.reduction = &local_4dea;
    local_4cf8.func = &local_4db0;
    local_4cc8.my_version = proxy_support;
    local_4cc8.my_traits = (context_traits)0x4;
    local_4cc8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_4cc8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_4cc8.my_name = CUSTOM_CTX;
    local_4db0.array2 = (Iterator<embree::GridMesh,_true> *)local_4dc0;
    local_4da0.array2 = (Iterator<embree::GridMesh,_true> *)this;
    local_4d90 = pmVar30;
    tbb::detail::r1::initialize(&local_4cc8);
    local_4db8 = (BBox1f)&local_4cf8;
    tbb::detail::d1::
    parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
              (0,sVar27,1,(anon_class_8_1_898bcfc2_conflict10 *)&local_4db8,&local_4de9,&local_4cc8)
    ;
    cVar13 = tbb::detail::r1::is_group_execution_cancelled(&local_4cc8);
    if (cVar13 != '\0') {
      prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar19,"task cancelled");
      __cxa_throw(prVar19,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_4cc8);
    aVar44.m128[1] = local_4d88.m128[1];
    aVar44.m128[0] = local_4d88.m128[0];
    aVar44.m128[2] = local_4d88.m128[2];
    aVar44.m128[3] = local_4d88.m128[3];
    aVar42.m128[1] = (float)uStack_4d74;
    aVar42.m128[0] = (float)local_4d78;
    aVar42.m128[2] = (float)uStack_4d70;
    aVar42.m128[3] = (float)uStack_4d6c;
    aVar40.m128[1] = (float)uStack_4d64;
    aVar40.m128[0] = (float)local_4d68;
    aVar40.m128[2] = (float)uStack_4d60;
    aVar40.m128[3] = (float)uStack_4d5c;
    aVar38.m128[1] = (float)uStack_4d54;
    aVar38.m128[0] = (float)local_4d58;
    aVar38.m128[2] = (float)uStack_4d50;
    aVar38.m128[3] = (float)uStack_4d4c;
    aVar36.m128[1] = (float)uStack_4d44;
    aVar36.m128[0] = (float)local_4d48;
    aVar36.m128[2] = (float)uStack_4d40;
    aVar36.m128[3] = (float)uStack_4d3c;
    aVar34.m128[1] = (float)uStack_4d34;
    aVar34.m128[0] = (float)local_4d38;
    aVar34.m128[2] = (float)uStack_4d30;
    aVar34.m128[3] = (float)uStack_4d2c;
    rVar46._end = uStack_4d20;
    rVar46._begin = local_4d28;
    auVar47._4_4_ = fStack_4d04;
    auVar47._0_4_ = local_4d08;
    auVar47._8_8_ = 0;
    auVar49._4_4_ = fStack_4cfc;
    auVar49._0_4_ = fStack_4d00;
    auVar49._8_8_ = 0;
    if (local_4dd8 != (BBox1f)0x0) {
      pBVar26 = &local_4c48.prefix_state.sums[0].max_time_range;
      do {
        uVar29 = *(ulong *)(*(undefined1 (*) [16])(pBVar26 + -0x482) + 8);
        auVar51._8_8_ = 0;
        auVar51._0_8_ = *(ulong *)*(undefined1 (*) [16])(pBVar26 + -0x480);
        (((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)(pBVar26 + -0x10))->
        super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.field_0 = aVar44;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar26 + -0xe) = aVar42;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar26 + -0xc) = aVar40;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar26 + -10) = aVar38;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar26 + -8) = aVar36;
        *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(pBVar26 + -6) = aVar34;
        *(range<unsigned_long> *)(pBVar26 + -4) = rVar46;
        pBVar26[-2] = (BBox1f)sStack_4d18;
        pBVar26[-1] = (BBox1f)sStack_4d10;
        auVar55 = vmovlhps_avx(auVar47,auVar49);
        *(undefined1 (*) [16])pBVar26 = auVar55;
        aVar44.m128 = (__m128)vminps_avx(aVar44.m128,*(undefined1 (*) [16])(pBVar26 + -0x490));
        aVar42.m128 = (__m128)vmaxps_avx(aVar42.m128,*(undefined1 (*) [16])(pBVar26 + -0x48e));
        aVar40.m128 = (__m128)vminps_avx(aVar40.m128,*(undefined1 (*) [16])(pBVar26 + -0x48c));
        aVar38.m128 = (__m128)vmaxps_avx(aVar38.m128,*(undefined1 (*) [16])(pBVar26 + -0x48a));
        aVar36.m128 = (__m128)vminps_avx(aVar36.m128,*(undefined1 (*) [16])(pBVar26 + -0x488));
        aVar34.m128 = (__m128)vmaxps_avx(aVar34.m128,*(undefined1 (*) [16])(pBVar26 + -0x486));
        rVar46 = (range<unsigned_long>)
                 vpaddq_avx((undefined1  [16])rVar46,*(undefined1 (*) [16])(pBVar26 + -0x484));
        sStack_4d18 = sStack_4d18 + *(long *)*(undefined1 (*) [16])(pBVar26 + -0x482);
        auVar54._8_8_ = 0;
        auVar54._0_8_ = *(ulong *)(*(undefined1 (*) [16])(pBVar26 + -0x480) + 8);
        auVar45 = vcmpps_avx(auVar49,auVar54,1);
        auVar53 = vinsertps_avx(auVar49,auVar54,0x50);
        auVar55 = vblendps_avx(auVar54,auVar49,2);
        auVar49 = vblendvps_avx(auVar55,auVar53,auVar45);
        bVar32 = sStack_4d10 < uVar29;
        if (sStack_4d10 <= uVar29) {
          sStack_4d10 = uVar29;
        }
        auVar55 = vpshufd_avx(ZEXT416((uint)CONCAT71((int7)(uVar29 >> 8),bVar32)),0x50);
        auVar55 = vpslld_avx(auVar55,0x1f);
        auVar47 = vblendvps_avx(auVar47,auVar51,auVar55);
        pBVar26 = pBVar26 + 0x12;
        local_4dd8 = (BBox1f)((long)local_4dd8 - 1);
      } while (local_4dd8 != (BBox1f)0x0);
    }
    auVar55 = vmovlhps_avx(auVar47,auVar49);
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    lower.field_0 = aVar44;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
    upper.field_0 = aVar42;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
    lower.field_0 = aVar40;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
    upper.field_0 = aVar38;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
    field_0 = aVar36;
    (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
    field_0 = aVar34;
    __return_storage_ptr__->object_range = rVar46;
    __return_storage_ptr__->num_time_segments = sStack_4d18;
    __return_storage_ptr__->max_num_time_segments = sStack_4d10;
    (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar55._0_8_;
    (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar55._0_8_ >> 0x20);
    (__return_storage_ptr__->time_range).lower = (float)(int)auVar55._8_8_;
    (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar55._8_8_ >> 0x20);
    __return_storage_ptr__->time_range = local_4de0;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefArrayMSMBlurGrid(Scene* scene, mvector<PrimRefMB>& prims, BuildProgressMonitor& progressMonitor, BBox1f t0t1 = BBox1f(0.0f,1.0f))
      {
        /* first run to get #primitives */
        ParallelForForPrefixSumState<PrimInfoMB> pstate;
        Scene::Iterator<GridMesh,true> iter(scene);

        pstate.init(iter,size_t(1024));
        /* iterate over all meshes in the scene */
        PrimInfoMB pinfoMB = parallel_for_for_prefix_sum0( pstate, iter, PrimInfoMB(empty), [&](GridMesh* mesh, const range<size_t>& r, size_t k, size_t /*geomID*/) -> PrimInfoMB {
            
            PrimInfoMB pinfoMB(empty);
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              if (!mesh->valid(j, mesh->timeSegmentRange(t0t1))) continue;
              LBBox3fa bounds(empty);
              PrimInfoMB gridMB(0,mesh->getNumSubGrids(j));
              pinfoMB.merge(gridMB);
            }
            return pinfoMB;
          }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
        
        size_t numPrimitives = pinfoMB.size();
        if (numPrimitives == 0) return pinfoMB;

        /* resize arrays */
        sgrids.resize(numPrimitives); 
        prims.resize(numPrimitives); 
        /* second run to fill primrefs and SubGridBuildData arrays */
        pinfoMB = parallel_for_for_prefix_sum1( pstate, iter, PrimInfoMB(empty), [&](GridMesh* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfoMB& base) -> PrimInfoMB {
            
            k = base.size();
            size_t p_index = k;
            PrimInfoMB pinfoMB(empty);
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              if (!mesh->valid(j, mesh->timeSegmentRange(t0t1))) continue;
              const GridMesh::Grid &g = mesh->grid(j);
              
              for (unsigned int y=0; y<g.resY-1u; y+=2)
                for (unsigned int x=0; x<g.resX-1u; x+=2)
                {
                  const PrimRefMB prim(mesh->linearBounds(g,x,y,t0t1),mesh->numTimeSegments(),mesh->time_range,mesh->numTimeSegments(),unsigned(geomID),unsigned(p_index));
                  pinfoMB.add_primref(prim);
                  sgrids[p_index] = SubGridBuildData(x | g.get3x3FlagsX(x), y | g.get3x3FlagsY(y), unsigned(j));
                  prims[p_index++] = prim;                
                }
            }
            return pinfoMB;
          }, [](const PrimInfoMB& a, const PrimInfoMB& b) -> PrimInfoMB { return PrimInfoMB::merge2(a,b); });
        
        assert(pinfoMB.size() == numPrimitives);
        pinfoMB.time_range = t0t1;
        return pinfoMB;
      }